

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Input.cxx
# Opt level: O0

int __thiscall Fl_Input::handle_key(Fl_Input *this)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  Fl_When FVar5;
  char *pcVar6;
  lconv *plVar7;
  size_t sVar8;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int __c;
  int __c_00;
  int local_6c;
  int local_60;
  int selected;
  uint multiline;
  uint shift;
  uint mods;
  int ip;
  char *chars;
  lconv *lc;
  size_t len;
  int del;
  char ascii;
  Fl_Input *this_local;
  
  _del = this;
  pcVar6 = Fl::event_text();
  len._7_1_ = *pcVar6;
  iVar1 = Fl::compose((int *)&len);
  if (iVar1 != 0) {
    iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_);
    if ((iVar1 != 1) && (iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_), iVar1 != 2)) {
      if (((int)len != 0) || (iVar1 = Fl::event_length(), iVar1 != 0)) {
        iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
        if (iVar1 == 0) {
          iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
          if ((int)len == 0) {
            local_6c = Fl_Input_::mark(&this->super_Fl_Input_);
          }
          else {
            local_6c = Fl_Input_::position(&this->super_Fl_Input_);
            local_6c = local_6c - (int)len;
          }
          pcVar6 = Fl::event_text();
          iVar2 = Fl::event_length();
          Fl_Input_::replace(&this->super_Fl_Input_,iVar1,local_6c,pcVar6,iVar2);
        }
        else {
          fl_beep(0);
        }
      }
      return 1;
    }
    Fl::compose_reset();
    if (legal_fp_chars == (char *)0x0) {
      lc = (lconv *)strlen(standard_fp_chars);
      plVar7 = localeconv();
      if (plVar7 != (lconv *)0x0) {
        if (plVar7->decimal_point != (char *)0x0) {
          sVar8 = strlen(plVar7->decimal_point);
          lc = (lconv *)((long)&lc->decimal_point + sVar8);
        }
        if (plVar7->mon_decimal_point != (char *)0x0) {
          sVar8 = strlen(plVar7->mon_decimal_point);
          lc = (lconv *)((long)&lc->decimal_point + sVar8);
        }
        if (plVar7->positive_sign != (char *)0x0) {
          sVar8 = strlen(plVar7->positive_sign);
          lc = (lconv *)((long)&lc->decimal_point + sVar8);
        }
        if (plVar7->negative_sign != (char *)0x0) {
          sVar8 = strlen(plVar7->negative_sign);
          lc = (lconv *)((long)&lc->decimal_point + sVar8);
        }
      }
      pcVar6 = (char *)malloc((size_t)((long)&lc->decimal_point + 1));
      legal_fp_chars = pcVar6;
      strcpy(pcVar6,standard_fp_chars);
      if (plVar7 != (lconv *)0x0) {
        if (plVar7->decimal_point != (char *)0x0) {
          strcat(pcVar6,plVar7->decimal_point);
        }
        if (plVar7->mon_decimal_point != (char *)0x0) {
          strcat(pcVar6,plVar7->mon_decimal_point);
        }
        if (plVar7->positive_sign != (char *)0x0) {
          strcat(pcVar6,plVar7->positive_sign);
        }
        if (plVar7->negative_sign != (char *)0x0) {
          strcat(pcVar6,plVar7->negative_sign);
        }
      }
    }
    iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
    iVar2 = Fl_Input_::mark(&this->super_Fl_Input_);
    if (iVar1 < iVar2) {
      local_60 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar1 = extraout_EDX;
    }
    else {
      local_60 = Fl_Input_::mark(&this->super_Fl_Input_);
      iVar1 = extraout_EDX_00;
    }
    if ((((((local_60 == 0) && ((len._7_1_ == '+' || (len._7_1_ == '-')))) ||
          (('/' < len._7_1_ && (len._7_1_ < ':')))) ||
         (((local_60 == 1 &&
           (pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,(char *)0x0,iVar1),
           iVar1 = extraout_EDX_01, (int)pcVar6 == 0x30)) &&
          ((len._7_1_ == 'x' || (len._7_1_ == 'X')))))) ||
        ((((1 < local_60 &&
           (pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,(char *)0x0,iVar1), (int)pcVar6 == 0x30
           )) && ((pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,&DAT_00000001,__c),
                  (int)pcVar6 == 0x78 ||
                  (pcVar6 = Fl_Input_::index(&this->super_Fl_Input_,&DAT_00000001,__c_00),
                  (int)pcVar6 == 0x58)))) &&
         ((('@' < len._7_1_ && (len._7_1_ < 'G')) || (('`' < len._7_1_ && (len._7_1_ < 'g'))))))))
       || (((iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_), iVar1 == 1 &&
            (len._7_1_ != '\0')) &&
           (pcVar6 = strchr(legal_fp_chars,(int)len._7_1_), pcVar6 != (char *)0x0)))) {
      iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
      if (iVar1 == 0) {
        iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
        iVar2 = Fl_Input_::mark(&this->super_Fl_Input_);
        Fl_Input_::replace(&this->super_Fl_Input_,iVar1,iVar2,(char *)((long)&len + 7),1);
      }
      else {
        fl_beep(0);
      }
    }
    return 1;
  }
  uVar3 = Fl::event_state();
  uVar3 = uVar3 & 0x4c0000;
  uVar4 = Fl::event_state();
  uVar4 = uVar4 & 0x10000;
  iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_);
  iVar2 = Fl::event_key();
  if (iVar2 == 0x61) {
    if (uVar3 == 0x40000) {
      iVar1 = kf_select_all(this);
      return iVar1;
    }
  }
  else if (iVar2 == 99) {
    if (uVar3 == 0x40000) {
      iVar1 = kf_copy(this);
      return iVar1;
    }
  }
  else if (iVar2 == 0x76) {
    if (uVar3 == 0x40000) {
      iVar1 = kf_paste(this);
      return iVar1;
    }
  }
  else if (iVar2 == 0x78) {
    if (uVar3 == 0x40000) {
      iVar1 = kf_copy_cut(this);
      return iVar1;
    }
  }
  else if (iVar2 == 0x7a) {
    if ((uVar3 == 0x40000) && (uVar4 == 0)) {
      iVar1 = kf_undo(this);
      return iVar1;
    }
    if ((uVar3 == 0x40000) && (uVar4 != 0)) {
      iVar1 = kf_redo(this);
      return iVar1;
    }
  }
  else {
    if (iVar2 == 0xff08) {
      if (uVar3 == 0) {
        iVar1 = kf_delete_char_left(this);
        return iVar1;
      }
      if (uVar3 == 0x40000) {
        iVar1 = kf_delete_word_left(this);
        return iVar1;
      }
      return 0;
    }
    if (iVar2 != 0xff09) {
      if (iVar2 != 0xff0d) {
        if (iVar2 == 0xff50) {
          if (uVar3 == 0) {
            iVar1 = kf_move_sol(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_top(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff51) {
          if (uVar3 == 0) {
            iVar1 = kf_move_char_left(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_move_word_left(this);
            return iVar1;
          }
          if (uVar3 == 0x400000) {
            iVar1 = kf_move_char_left(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff52) {
          if (uVar3 == 0) {
            iVar1 = kf_lines_up(this,1);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_move_up_and_sol(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff53) {
          if (uVar3 == 0) {
            iVar1 = kf_move_char_right(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_move_word_right(this);
            return iVar1;
          }
          if (uVar3 == 0x400000) {
            iVar1 = kf_move_char_right(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff54) {
          if (uVar3 == 0) {
            iVar1 = kf_lines_down(this,1);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_move_down_and_eol(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff55) {
          if (uVar3 == 0) {
            iVar1 = kf_page_up(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_page_up(this);
            return iVar1;
          }
          if (uVar3 == 0x80000) {
            iVar1 = kf_page_up(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff56) {
          if (uVar3 == 0) {
            iVar1 = kf_page_down(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_page_down(this);
            return iVar1;
          }
          if (uVar3 == 0x80000) {
            iVar1 = kf_page_down(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff57) {
          if (uVar3 == 0) {
            iVar1 = kf_move_eol(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_bottom(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 == 0xff63) {
          if ((uVar3 == 0) && (uVar4 != 0)) {
            iVar1 = kf_paste(this);
            return iVar1;
          }
          if (uVar3 == 0) {
            iVar1 = kf_insert_toggle(this);
            return iVar1;
          }
          if (uVar3 == 0x40000) {
            iVar1 = kf_copy(this);
            return iVar1;
          }
          return 0;
        }
        if (iVar2 != 0xff8d) {
          if (iVar2 == 0xffff) {
            iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
            iVar2 = Fl_Input_::mark(&this->super_Fl_Input_);
            if (((uVar3 == 0) && (uVar4 != 0)) && (iVar1 != iVar2)) {
              iVar1 = kf_copy_cut(this);
              return iVar1;
            }
            if (((uVar3 == 0) && (uVar4 != 0)) && (iVar1 == iVar2)) {
              iVar1 = kf_delete_char_right(this);
              return iVar1;
            }
            if (uVar3 == 0) {
              iVar1 = kf_delete_char_right(this);
              return iVar1;
            }
            if (uVar3 == 0x40000) {
              iVar1 = kf_delete_word_right(this);
              return iVar1;
            }
            return 0;
          }
          goto LAB_001f675f;
        }
      }
      FVar5 = Fl_Widget::when((Fl_Widget *)this);
      if ((FVar5 & FL_WHEN_ENTER_KEY) != FL_WHEN_NEVER) {
        iVar1 = Fl_Input_::size(&this->super_Fl_Input_);
        Fl_Input_::position(&this->super_Fl_Input_,iVar1,0);
        Fl_Input_::maybe_do_callback(&this->super_Fl_Input_);
        return 1;
      }
      if ((iVar1 == 4) && (iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_), iVar1 == 0)) {
        iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
        iVar2 = Fl_Input_::mark(&this->super_Fl_Input_);
        iVar1 = Fl_Input_::replace(&this->super_Fl_Input_,iVar1,iVar2,"\n",1);
        return iVar1;
      }
      return 0;
    }
    if ((((uVar3 != 0) || (uVar4 != 0)) ||
        (iVar2 = Fl_Input_::tab_nav(&this->super_Fl_Input_), iVar2 != 0)) || (iVar1 != 4)) {
      if (uVar3 == 0) {
        return 0;
      }
      return 0;
    }
  }
LAB_001f675f:
  iVar1 = (int)len._7_1_;
  if (iVar1 == 8) {
    iVar1 = kf_delete_char_left(this);
    return iVar1;
  }
  if ((iVar1 - 9U < 2) || (iVar1 - 0xcU < 2)) {
    iVar1 = Fl_Input_::readonly(&this->super_Fl_Input_);
    if (iVar1 != 0) {
      fl_beep(0);
      return 1;
    }
    iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_);
    if ((iVar1 != 1) && (iVar1 = Fl_Input_::input_type(&this->super_Fl_Input_), iVar1 != 2)) {
      iVar1 = Fl_Input_::position(&this->super_Fl_Input_);
      iVar2 = Fl_Input_::mark(&this->super_Fl_Input_);
      iVar1 = Fl_Input_::replace(&this->super_Fl_Input_,iVar1,iVar2,(char *)((long)&len + 7),1);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

int Fl_Input::handle_key() {
  
  char ascii = Fl::event_text()[0];
  
  int del;
  if (Fl::compose(del)) {
    
    // Insert characters into numeric fields after checking for legality:
    if (input_type() == FL_FLOAT_INPUT || input_type() == FL_INT_INPUT) {
      Fl::compose_reset(); // ignore any foreign letters...
      
      // initialize the list of legal characters inside a floating point number
#ifdef HAVE_LOCALECONV
      if (!legal_fp_chars) {
        size_t len = strlen(standard_fp_chars);
        struct lconv *lc = localeconv();
        if (lc) {
          if (lc->decimal_point) len += strlen(lc->decimal_point);
          if (lc->mon_decimal_point) len += strlen(lc->mon_decimal_point);
          if (lc->positive_sign) len += strlen(lc->positive_sign);
          if (lc->negative_sign) len += strlen(lc->negative_sign);
        }
        // the following line is not a true memory leak because the array is only
        // allocated once if required, and automatically freed when the program quits
        char *chars = (char*)malloc(len+1);
	legal_fp_chars = chars;
        strcpy(chars, standard_fp_chars);
        if (lc) {
          if (lc->decimal_point) strcat(chars, lc->decimal_point);
          if (lc->mon_decimal_point) strcat(chars, lc->mon_decimal_point);
          if (lc->positive_sign) strcat(chars, lc->positive_sign);
          if (lc->negative_sign) strcat(chars, lc->negative_sign);
        }
      }
#endif // HAVE_LOCALECONV
      
      // find the insert position
      int ip = position()<mark() ? position() : mark();
      // This is complex to allow "0xff12" hex to be typed:
      if (   (!ip && (ascii == '+' || ascii == '-')) 
          || (ascii >= '0' && ascii <= '9') 
          || (ip==1 && index(0)=='0' && (ascii=='x' || ascii == 'X')) 
          || (ip>1 && index(0)=='0' && (index(1)=='x'||index(1)=='X') 
              && ((ascii>='A'&& ascii<='F') || (ascii>='a'&& ascii<='f'))) 
          || (input_type()==FL_FLOAT_INPUT && ascii && strchr(legal_fp_chars, ascii))) 
      {
	if (readonly()) fl_beep();
	else replace(position(), mark(), &ascii, 1);
      }
      return 1;
    }
    
    if (del || Fl::event_length()) {
      if (readonly()) fl_beep();
      else replace(position(), del ? position()-del : mark(),
	           Fl::event_text(), Fl::event_length());
    }
#ifdef __APPLE__
    if (Fl::compose_state) {
      this->mark( this->position() - Fl::compose_state );
      }
#endif
    return 1;
  }
  
  unsigned int mods = Fl::event_state() & (FL_META|FL_CTRL|FL_ALT);
  unsigned int shift = Fl::event_state() & FL_SHIFT;
  unsigned int multiline = (input_type() == FL_MULTILINE_INPUT) ? 1 : 0;
  //
  // The following lists apps that support these keypresses.
  // Prefixes: '!' indicates NOT supported, '?' indicates un-verified.
  //
  //    HIG=Human Interface Guide, 
  //    TE=TextEdit.app, SA=Safari.app, WOX=MS Word/OSX -- OSX 10.4.x
  //    NP=Notepad, WP=WordPad, WOW=MS Word/Windows     -- WinXP
  //    GE=gedit, KE=kedit                              -- Ubuntu8.04
  //    OF=old FLTK behavior (<=1.1.10)
  //
  // Example: (NP,WP,!WO) means supported in notepad + wordpad, but NOT word.
  //
  switch (Fl::event_key()) {

    case FL_Insert:
      // Note: Mac has no "Insert" key; it's the "Help" key.
      //       This keypress is apparently not possible on macs.
      //
      if (mods==0 && shift) return kf_paste();			// Shift-Insert   (WP,NP,WOW,GE,KE,OF)
      if (mods==0)          return kf_insert_toggle();		// Insert         (Standard)
      if (mods==FL_CTRL)    return kf_copy();			// Ctrl-Insert    (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent

    case FL_Delete: {
#ifdef __APPLE__
      if (mods==0)          return kf_delete_char_right();	// Delete         (OSX-HIG,TE,SA,WOX)
      if (mods==FL_CTRL)    return kf_delete_char_right();	// Ctrl-Delete    (??? TE,!SA,!WOX)
      if (mods==FL_ALT)     return kf_delete_word_right();	// Alt-Delete     (OSX-HIG,TE,SA)
      return 0;							// ignore other combos, pass to parent
#else
      int selected = (position() != mark()) ? 1 : 0;
      if (mods==0 && shift && selected)
                            return kf_copy_cut();		// Shift-Delete with selection (WP,NP,WOW,GE,KE,OF)
      if (mods==0 && shift && !selected)
                            return kf_delete_char_right();	// Shift-Delete no selection (WP,NP,WOW,GE,KE,!OF)
      if (mods==0)          return kf_delete_char_right();	// Delete         (Standard)
      if (mods==FL_CTRL)    return kf_delete_word_right();	// Ctrl-Delete    (WP,!NP,WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif
    }

    case FL_Left:
#ifdef __APPLE__
      if (mods==0)          return kf_move_char_left();		// Left           (OSX-HIG)
      if (mods==FL_ALT)     return kf_move_word_left();		// Alt-Left       (OSX-HIG)
      if (mods==FL_META)    return kf_move_sol();		// Meta-Left      (OSX-HIG)
      if (mods==FL_CTRL)    return kf_move_sol();		// Ctrl-Left      (TE/SA)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_char_left();		// Left           (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_word_left();		// Ctrl-Left      (WP,NP,WOW,GE,KE,!OF)
      if (mods==FL_META)    return kf_move_char_left();		// Meta-Left      (WP,NP,?WOW,GE,KE)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Right:
#ifdef __APPLE__
      if (mods==0)          return kf_move_char_right();	// Right          (OSX-HIG)
      if (mods==FL_ALT)     return kf_move_word_right();	// Alt-Right      (OSX-HIG)
      if (mods==FL_META)    return kf_move_eol();		// Meta-Right     (OSX-HIG)
      if (mods==FL_CTRL)    return kf_move_eol();		// Ctrl-Right     (TE/SA)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_char_right();	// Right          (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_word_right();	// Ctrl-Right     (WP,NP,WOW,GE,KE,!OF)
      if (mods==FL_META)    return kf_move_char_right();	// Meta-Right     (WP,NP,?WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Up:
#ifdef __APPLE__
      if (mods==0)          return kf_lines_up(1);		// Up             (OSX-HIG)
      if (mods==FL_CTRL)    return kf_page_up();		// Ctrl-Up        (TE !HIG)
      if (mods==FL_ALT)     return kf_move_up_and_sol();	// Alt-Up         (OSX-HIG)
      if (mods==FL_META)    return kf_top();			// Meta-Up        (OSX-HIG)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_lines_up(1);		// Up             (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_up_and_sol();	// Ctrl-Up        (WP,!NP,WOW,GE,!KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Down:
#ifdef __APPLE__
      if (mods==0)          return kf_lines_down(1);		// Dn             (OSX-HIG)
      if (mods==FL_CTRL)    return kf_page_down();		// Ctrl-Dn        (TE !HIG)
      if (mods==FL_ALT)     return kf_move_down_and_eol();	// Alt-Dn         (OSX-HIG)
      if (mods==FL_META)    return kf_bottom();			// Meta-Dn        (OSX-HIG)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_lines_down(1);		// Dn             (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_move_down_and_eol();	// Ctrl-Down      (WP,!NP,WOW,GE,!KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Page_Up:
      // Fl_Input has no scroll control, so instead we move the cursor by one page
      // OSX-HIG recommends Alt increase one semantic unit, Meta next higher..
#ifdef __APPLE__
      if (mods==0)          return kf_page_up();		// PgUp           (OSX-HIG)
      if (mods==FL_ALT)     return kf_page_up();		// Alt-PageUp     (OSX-HIG)
      if (mods==FL_META)    return kf_top();			// Meta-PageUp    (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_page_up();		// PageUp         (WP,NP,WOW,GE,KE)
      if (mods==FL_CTRL)    return kf_page_up();		// Ctrl-PageUp    (!WP,!NP,!WOW,!GE,KE,OF)
      if (mods==FL_ALT)     return kf_page_up();		// Alt-PageUp     (!WP,!NP,!WOW,!GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Page_Down:
#ifdef __APPLE__
      // Fl_Input has no scroll control, so instead we move the cursor by one page
      // OSX-HIG recommends Alt increase one semantic unit, Meta next higher..
      if (mods==0)          return kf_page_down();		// PgDn           (OSX-HIG)
      if (mods==FL_ALT)     return kf_page_down();		// Alt-PageDn     (OSX-HIG)
      if (mods==FL_META)    return kf_bottom();			// Meta-PageDn    (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_page_down();		// PageDn         (WP,NP,WOW,GE,KE)
      if (mods==FL_CTRL)    return kf_page_down();		// Ctrl-PageDn    (!WP,!NP,!WOW,!GE,KE,OF)
      if (mods==FL_ALT)     return kf_page_down();		// Alt-PageDn     (!WP,!NP,!WOW,!GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Home:
#ifdef __APPLE__
      if (mods==0)          return kf_top();			// Home           (OSX-HIG)
      if (mods==FL_ALT)     return kf_top();			// Alt-Home       (???)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_sol();		// Home           (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_top();			// Ctrl-Home      (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_End:
#ifdef __APPLE__
      if (mods==0)          return kf_bottom();			// End            (OSX-HIG)
      if (mods==FL_ALT)     return kf_bottom();			// Alt-End        (???)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_move_eol();		// End            (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_bottom();			// Ctrl-End       (WP,NP,WOW,GE,KE,OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_BackSpace:
#ifdef __APPLE__
      if (mods==0)          return kf_delete_char_left();	// Backspace      (OSX-HIG)
      if (mods==FL_CTRL)    return kf_delete_char_left();	// Ctrl-Backspace (TE/SA)
      if (mods==FL_ALT)     return kf_delete_word_left();	// Alt-Backspace  (OSX-HIG)
      if (mods==FL_META)    return kf_delete_sol();		// Meta-Backspace (OSX-HIG,!TE)
      return 0;							// ignore other combos, pass to parent
#else
      if (mods==0)          return kf_delete_char_left();	// Backspace      (WP,NP,WOW,GE,KE,OF)
      if (mods==FL_CTRL)    return kf_delete_word_left();	// Ctrl-Backspace (WP,!NP,WOW,GE,KE,!OF)
      return 0;							// ignore other combos, pass to parent
#endif

    case FL_Enter:
    case FL_KP_Enter:
      if (when() & FL_WHEN_ENTER_KEY) {
        position(size(), 0);
        maybe_do_callback();
        return 1;
      } else if (multiline && !readonly()) {
        return replace(position(), mark(), "\n", 1);
      } return 0;			// reserved for shortcuts

    case FL_Tab:
      // Handle special case for multiline input with 'old tab behavior';
      // tab handled as a normal insertable character.
      //
      if (mods==0 && !shift 		// Tab?
	   && !tab_nav()		// old tab behavior enabled?
	   && multiline) {		// multiline input?
        break;				// insert tab character
      }
      if (mods==0) return 0;					// Tab, Shift-Tab? nav focus      (Standard/OSX-HIG)
      return 0;							// ignore other combos, pass to parent

    case 'a':
      if (mods==FL_COMMAND) return kf_select_all();		// Ctrl-A, Mac:Meta-A             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'c':
      if (mods==FL_COMMAND) return kf_copy();			// Ctrl-C, Mac:Meta-C             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'v':
      if (mods==FL_COMMAND) return kf_paste();			// Ctrl-V, Mac:Meta-V             (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
    case 'x':
      if (mods==FL_COMMAND) return kf_copy_cut();		// Ctrl-X, Mac:Meta-X             (Standard/OSX-HIG)
      break;
    case 'z':
      if (mods==FL_COMMAND && !shift) return kf_undo();		// Ctrl-Z, Mac:Meta-Z             (Standard/OSX-HIG)
      if (mods==FL_COMMAND && shift)  return kf_redo();		// Shift-Ctrl-Z, Mac:Shift-Meta-Z (Standard/OSX-HIG)
      break;							// handle other combos elsewhere
  }
  
  switch (ascii) {
    case ctrl('H'):
      return kf_delete_char_left();				// Ctrl-H                           (!WP,!NP,!WOW,!WOX,TE,SA,GE,KE,OF)
    case ctrl('I'): 						// Ctrl-I (literal Tab)             (!WP,NP,!WOW,!GE,KE,OF)
    case ctrl('J'):						// Ctrl-J (literal Line Feed/Enter) (Standard)
    case ctrl('L'):						// Ctrl-L (literal Form Feed)       (Standard)
    case ctrl('M'):						// Ctrl-M (literal Cr)              (Standard)
      if (readonly()) { fl_beep(); return 1; }
      // insert a few selected control characters literally:
      if (input_type() != FL_FLOAT_INPUT && input_type() != FL_INT_INPUT)
        return replace(position(), mark(), &ascii, 1);
      break;
  }
  
  return 0;		// ignored
}